

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::up(TimerMgr *this,size_t idx)

{
  ulong uVar1;
  size_t __n;
  size_t __n_00;
  reference ppTVar2;
  size_t offsetP;
  size_t offsetIdx;
  size_t p;
  size_t idx_local;
  TimerMgr *this_local;
  
  offsetIdx = parent(this,idx);
  p = idx;
  while( true ) {
    if (offsetIdx == 0) {
      return;
    }
    __n = getOffset(this,p);
    __n_00 = getOffset(this,offsetIdx);
    ppTVar2 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n);
    uVar1 = (*ppTVar2)->mExpiredTime;
    ppTVar2 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n_00);
    if ((*ppTVar2)->mExpiredTime <= uVar1) break;
    swap(this,p,offsetIdx);
    p = offsetIdx;
    offsetIdx = parent(this,offsetIdx);
  }
  return;
}

Assistant:

void up(size_t idx) {
		auto p = parent(idx);
		while(p > 0) {
			auto offsetIdx = getOffset(idx);
			auto offsetP = getOffset(p);
			if(this->elements[offsetIdx]->mExpiredTime < this->elements[offsetP]->mExpiredTime) {
				this->swap(idx,p);
				idx = p;
				p = parent(idx);
			} else {
				break;
			}
		}
	}